

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<char_*>::item::~item(item *this)

{
  char **ppcVar1;
  
  ppcVar1 = this->pData;
  if (ppcVar1 == (char **)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
    ppcVar1 = this->pData;
  }
  operator_delete(ppcVar1,8);
  this->pData = (char **)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }